

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3_api_wrapper.cpp
# Opt level: O2

int duckdb_shell_sqlite3_bind_text
              (sqlite3_stmt *stmt,int idx,char *val,int length,_func_void_void_ptr *free_func)

{
  int iVar1;
  allocator local_c9;
  string value;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  string local_88;
  Value local_68;
  
  if (val == (char *)0x0) {
    iVar1 = 0x15;
  }
  else {
    value._M_dataplus._M_p = (pointer)&value.field_2;
    value._M_string_length = 0;
    value.field_2._M_local_buf[0] = '\0';
    if (length < 0) {
      std::__cxx11::string::string((string *)local_a8,val,&local_c9);
    }
    else {
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,val,val + (uint)length);
    }
    std::__cxx11::string::operator=((string *)&value,(string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    if ((code *)0x1 < free_func + 1) {
      (*free_func)(val);
    }
    std::__cxx11::string::string((string *)&local_88,(string *)&value);
    duckdb::Value::Value(&local_68,&local_88);
    iVar1 = sqlite3_internal_bind_value(stmt,idx,&local_68);
    duckdb::Value::~Value(&local_68);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&value);
  }
  return iVar1;
}

Assistant:

int sqlite3_bind_text(sqlite3_stmt *stmt, int idx, const char *val, int length, void (*free_func)(void *)) {
	if (!val) {
		return SQLITE_MISUSE;
	}
	string value;
	if (length < 0) {
		value = string(val);
	} else {
		value = string(val, length);
	}
	if (free_func && ((ptrdiff_t)free_func) != -1) {
		free_func((void *)val);
		val = nullptr;
	}
	try {
		return sqlite3_internal_bind_value(stmt, idx, Value(value));
	} catch (std::exception &ex) {
		return SQLITE_ERROR;
	}
}